

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall Pathie::Path::rmtree(Path *this)

{
  bool bVar1;
  char *in_RSI;
  Path *__path;
  pointer path;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> kids;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> local_78;
  Path local_60;
  Path local_40;
  
  bVar1 = is_directory(this);
  if (bVar1) {
    __path = this;
    children(&local_78,this);
    for (path = local_78.super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>._M_impl.
                super__Vector_impl_data._M_start;
        path != local_78.super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>._M_impl.
                super__Vector_impl_data._M_finish; path = path + 1) {
      Path(&local_60,path);
      __path = this;
      join(&local_40,this,&local_60);
      rmtree(&local_40);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    rmdir(this,(char *)__path);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::~vector(&local_78);
    return;
  }
  unlink(this,in_RSI);
  return;
}

Assistant:

void Path::rmtree() const
{
  if (is_directory()) {
    std::vector<Path> kids = children();

    for(std::vector<Path>::iterator iter=kids.begin(); iter != kids.end(); iter++) {
       join(*iter).rmtree();
    }

    rmdir();
  }
  else { // file or similar
    unlink();
  }
}